

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# labeling_wychang_2015.h
# Opt level: O0

void __thiscall CCIT<UFPC>::FirstScan(CCIT<UFPC> *this)

{
  int iVar1;
  int iVar2;
  long lVar3;
  long lVar4;
  bool bVar5;
  long lVar6;
  int iVar7;
  uint uVar8;
  uchar *puVar9;
  uint *puVar10;
  int local_7c;
  int x_1;
  uint *img_labels_row_prev_prev;
  uint *img_labels_row_1;
  uchar *img_row_fol_1;
  uchar *img_row_prev;
  uchar *img_row_1;
  int y_1;
  int x;
  uint *img_labels_row;
  uchar *img_row_fol;
  uchar *img_row;
  int y;
  bool nextprocedure2;
  int k;
  int v;
  int u;
  int lx;
  int h;
  int w;
  CCIT<UFPC> *this_local;
  
  memset(*(void **)&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_labels_)->field_0x10,0,
         *(long *)&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_labels_)->field_0x20 -
         *(long *)&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_labels_)->field_0x18);
  UFPC::Setup();
  iVar1 = *(int *)&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_labels_)->field_0xc;
  iVar2 = *(int *)&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_labels_)->field_0x8;
  puVar9 = cv::Mat::ptr<unsigned_char>
                     (&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_)->super_Mat,0);
  lVar3 = **(long **)&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_)->field_0x48;
  puVar10 = cv::Mat::ptr<unsigned_int>
                      (&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_labels_)->super_Mat,
                       0);
  for (img_row_1._4_4_ = 0; img_row_1._4_4_ < iVar1; img_row_1._4_4_ = img_row_1._4_4_ + 2) {
    if (puVar9[img_row_1._4_4_] == '\0') {
      if ((img_row_1._4_4_ + 1 < iVar1) && (puVar9[img_row_1._4_4_ + 1] != '\0')) {
        v = UFPC::NewLabel();
        puVar10[img_row_1._4_4_] = v;
        bVar5 = true;
      }
      else if ((iVar2 < 2) || (puVar9[img_row_1._4_4_ + lVar3] == '\0')) {
        if (((img_row_1._4_4_ + 1 < iVar1) && (1 < iVar2)) &&
           (puVar9[(img_row_1._4_4_ + 1) + lVar3] != '\0')) {
          v = UFPC::NewLabel();
          puVar10[img_row_1._4_4_] = v;
          bVar5 = true;
        }
        else {
          bVar5 = false;
        }
      }
      else {
        v = UFPC::NewLabel();
        puVar10[img_row_1._4_4_] = v;
        if (((img_row_1._4_4_ + 1 < iVar1) && (1 < iVar2)) &&
           (puVar9[(img_row_1._4_4_ + 1) + lVar3] != '\0')) {
          bVar5 = true;
        }
        else {
          bVar5 = false;
        }
      }
    }
    else {
      v = UFPC::NewLabel();
      puVar10[img_row_1._4_4_] = v;
      if (((img_row_1._4_4_ + 1 < iVar1) && (puVar9[img_row_1._4_4_ + 1] != '\0')) ||
         ((img_row_1._4_4_ + 1 < iVar1 &&
          ((1 < iVar2 && (puVar9[(img_row_1._4_4_ + 1) + lVar3] != '\0')))))) {
        bVar5 = true;
      }
      else {
        bVar5 = false;
      }
    }
    while (bVar5 && img_row_1._4_4_ + 2 < iVar1) {
      iVar7 = img_row_1._4_4_ + 2;
      if (puVar9[iVar7] == '\0') {
        if ((img_row_1._4_4_ + 3 < iVar1) && (puVar9[img_row_1._4_4_ + 3] != '\0')) {
          if ((iVar2 < 2) || (puVar9[iVar7 + lVar3] == '\0')) {
            v = UFPC::NewLabel();
            puVar10[iVar7] = v;
          }
          else {
            puVar10[iVar7] = v;
          }
          bVar5 = true;
          img_row_1._4_4_ = iVar7;
        }
        else if ((iVar2 < 2) || (puVar9[iVar7 + lVar3] == '\0')) {
          if (((img_row_1._4_4_ + 3 < iVar1) && (1 < iVar2)) &&
             (puVar9[(img_row_1._4_4_ + 3) + lVar3] != '\0')) {
            v = UFPC::NewLabel();
            puVar10[iVar7] = v;
            bVar5 = true;
            img_row_1._4_4_ = iVar7;
          }
          else {
            bVar5 = false;
            img_row_1._4_4_ = iVar7;
          }
        }
        else {
          puVar10[iVar7] = v;
          if (((img_row_1._4_4_ + 3 < iVar1) && (1 < iVar2)) &&
             (puVar9[(img_row_1._4_4_ + 3) + lVar3] != '\0')) {
            bVar5 = true;
            img_row_1._4_4_ = iVar7;
          }
          else {
            bVar5 = false;
            img_row_1._4_4_ = iVar7;
          }
        }
      }
      else {
        puVar10[iVar7] = v;
        if (((img_row_1._4_4_ + 3 < iVar1) && (puVar9[img_row_1._4_4_ + 3] != '\0')) ||
           ((img_row_1._4_4_ + 3 < iVar1 &&
            ((1 < iVar2 && (puVar9[(img_row_1._4_4_ + 3) + lVar3] != '\0')))))) {
          bVar5 = true;
          img_row_1._4_4_ = iVar7;
        }
        else {
          bVar5 = false;
          img_row_1._4_4_ = iVar7;
        }
      }
    }
  }
  for (img_row_1._0_4_ = 2; (int)img_row_1 < iVar2; img_row_1._0_4_ = (int)img_row_1 + 2) {
    puVar9 = cv::Mat::ptr<unsigned_char>
                       (&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_)->super_Mat,
                        (int)img_row_1);
    lVar3 = **(long **)&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_)->field_0x48;
    lVar4 = **(long **)&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_)->field_0x48;
    puVar10 = cv::Mat::ptr<unsigned_int>
                        (&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_labels_)->
                          super_Mat,(int)img_row_1);
    lVar6 = -**(long **)&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_labels_)->
                         field_0x48 -
            **(long **)&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_labels_)->field_0x48
    ;
    for (local_7c = 0; local_7c < iVar1; local_7c = local_7c + 2) {
      if (puVar9[local_7c] == '\0') {
        if ((local_7c + 1 < iVar1) && (puVar9[local_7c + 1] != '\0')) {
          if ((local_7c + 1 < iVar1) && (puVar9[(local_7c + 1) - lVar3] != '\0')) {
            v = *(uint *)((long)puVar10 + (long)local_7c * 4 + lVar6);
            puVar10[local_7c] = v;
          }
          else if (puVar9[local_7c - lVar3] == '\0') {
            if ((local_7c + 2 < iVar1) && (puVar9[(local_7c + 2) - lVar3] != '\0')) {
              v = *(uint *)((long)puVar10 + (long)(local_7c + 2) * 4 + lVar6);
              puVar10[local_7c] = v;
            }
            else {
              v = UFPC::NewLabel();
              puVar10[local_7c] = v;
            }
          }
          else {
            v = *(uint *)((long)puVar10 + (long)local_7c * 4 + lVar6);
            puVar10[local_7c] = v;
            if ((local_7c + 2 < iVar1) && (puVar9[(local_7c + 2) - lVar3] != '\0')) {
              UFPC::Merge(v,*(uint *)((long)puVar10 + (long)(local_7c + 2) * 4 + lVar6));
            }
          }
          bVar5 = true;
        }
        else if (((int)img_row_1 + 1 < iVar2) && (puVar9[local_7c + lVar4] != '\0')) {
          v = UFPC::NewLabel();
          puVar10[local_7c] = v;
          if (((local_7c + 1 < iVar1) && ((int)img_row_1 + 1 < iVar2)) &&
             (puVar9[(local_7c + 1) + lVar4] != '\0')) {
            bVar5 = true;
          }
          else {
            bVar5 = false;
          }
        }
        else if (((local_7c + 1 < iVar1) && ((int)img_row_1 + 1 < iVar2)) &&
                (puVar9[(local_7c + 1) + lVar4] != '\0')) {
          v = UFPC::NewLabel();
          puVar10[local_7c] = v;
          bVar5 = true;
        }
        else {
          bVar5 = false;
        }
      }
      else if ((local_7c + 1 < iVar1) && (puVar9[local_7c + 1] != '\0')) {
        if (puVar9[local_7c - lVar3] == '\0') {
          if ((local_7c + 1 < iVar1) && (puVar9[(local_7c + 1) - lVar3] != '\0')) {
            v = *(uint *)((long)puVar10 + (long)local_7c * 4 + lVar6);
            puVar10[local_7c] = v;
            if ((0 < local_7c + -1) && (puVar9[(local_7c + -1) - lVar3] != '\0')) {
              UFPC::Merge(v,*(uint *)((long)puVar10 + (long)(local_7c + -2) * 4 + lVar6));
            }
          }
          else if ((local_7c + -1 < 1) || (puVar9[(local_7c + -1) - lVar3] == '\0')) {
            if ((local_7c + 2 < iVar1) && (puVar9[(local_7c + 2) - lVar3] != '\0')) {
              v = *(uint *)((long)puVar10 + (long)(local_7c + 2) * 4 + lVar6);
              puVar10[local_7c] = v;
            }
            else {
              v = UFPC::NewLabel();
              puVar10[local_7c] = v;
            }
          }
          else {
            v = *(uint *)((long)puVar10 + (long)(local_7c + -2) * 4 + lVar6);
            puVar10[local_7c] = v;
            if ((local_7c + 2 < iVar1) && (puVar9[(local_7c + 2) - lVar3] != '\0')) {
              UFPC::Merge(v,*(uint *)((long)puVar10 + (long)(local_7c + 2) * 4 + lVar6));
            }
          }
        }
        else {
          v = *(uint *)((long)puVar10 + (long)local_7c * 4 + lVar6);
          puVar10[local_7c] = v;
          if ((((iVar1 <= local_7c + 1) || (puVar9[(local_7c + 1) - lVar3] == '\0')) &&
              (local_7c + 2 < iVar1)) && (puVar9[(local_7c + 2) - lVar3] != '\0')) {
            UFPC::Merge(v,*(uint *)((long)puVar10 + (long)(local_7c + 2) * 4 + lVar6));
          }
        }
        bVar5 = true;
      }
      else {
        if (puVar9[local_7c - lVar3] == '\0') {
          if ((local_7c + -1 < 1) || (puVar9[(local_7c + -1) - lVar3] == '\0')) {
            if ((local_7c + 1 < iVar1) && (puVar9[(local_7c + 1) - lVar3] != '\0')) {
              v = *(uint *)((long)puVar10 + (long)local_7c * 4 + lVar6);
              puVar10[local_7c] = v;
            }
            else {
              v = UFPC::NewLabel();
              puVar10[local_7c] = v;
            }
          }
          else {
            v = *(uint *)((long)puVar10 + (long)(local_7c + -2) * 4 + lVar6);
            puVar10[local_7c] = v;
            if ((local_7c + 1 < iVar1) && (puVar9[(local_7c + 1) - lVar3] != '\0')) {
              UFPC::Merge(v,*(uint *)((long)puVar10 + (long)local_7c * 4 + lVar6));
            }
          }
        }
        else {
          v = *(uint *)((long)puVar10 + (long)local_7c * 4 + lVar6);
          puVar10[local_7c] = v;
        }
        if (((local_7c + 1 < iVar1) && ((int)img_row_1 + 1 < iVar2)) &&
           (puVar9[(local_7c + 1) + lVar4] != '\0')) {
          bVar5 = true;
        }
        else {
          bVar5 = false;
        }
      }
      while (bVar5 && local_7c + 2 < iVar1) {
        iVar7 = local_7c + 2;
        if (puVar9[iVar7] == '\0') {
          if ((local_7c + 3 < iVar1) && (puVar9[local_7c + 3] != '\0')) {
            if (((int)img_row_1 + 1 < iVar2) && (puVar9[iVar7 + lVar4] != '\0')) {
              puVar10[iVar7] = v;
              if ((local_7c + 3 < iVar1) && (puVar9[(local_7c + 3) - lVar3] != '\0')) {
                UFPC::Merge(v,*(uint *)((long)puVar10 + (long)iVar7 * 4 + lVar6));
              }
              else if (puVar9[iVar7 - lVar3] != '\0') {
                if ((local_7c + 4 < iVar1) && (puVar9[(local_7c + 4) - lVar3] != '\0')) {
                  uVar8 = UFPC::Merge(*(uint *)((long)puVar10 + (long)iVar7 * 4 + lVar6),
                                      *(uint *)((long)puVar10 + (long)(local_7c + 4) * 4 + lVar6));
                  UFPC::Merge(v,uVar8);
                }
                else {
                  UFPC::Merge(v,*(uint *)((long)puVar10 + (long)iVar7 * 4 + lVar6));
                }
              }
              if ((local_7c + 4 < iVar1) && (puVar9[(local_7c + 4) - lVar3] != '\0')) {
                UFPC::Merge(v,*(uint *)((long)puVar10 + (long)(local_7c + 4) * 4 + lVar6));
              }
            }
            else if ((local_7c + 3 < iVar1) && (puVar9[(local_7c + 3) - lVar3] != '\0')) {
              v = *(uint *)((long)puVar10 + (long)iVar7 * 4 + lVar6);
              puVar10[iVar7] = v;
            }
            else if (puVar9[iVar7 - lVar3] == '\0') {
              if ((local_7c + 4 < iVar1) && (puVar9[(local_7c + 4) - lVar3] != '\0')) {
                v = *(uint *)((long)puVar10 + (long)(local_7c + 4) * 4 + lVar6);
                puVar10[iVar7] = v;
              }
              else {
                v = UFPC::NewLabel();
                puVar10[iVar7] = v;
              }
            }
            else {
              v = *(uint *)((long)puVar10 + (long)iVar7 * 4 + lVar6);
              puVar10[iVar7] = v;
              if ((local_7c + 4 < iVar1) && (puVar9[(local_7c + 4) - lVar3] != '\0')) {
                UFPC::Merge(v,*(uint *)((long)puVar10 + (long)(local_7c + 4) * 4 + lVar6));
              }
            }
            bVar5 = true;
            local_7c = iVar7;
          }
          else if (((int)img_row_1 + 1 < iVar2) && (puVar9[iVar7 + lVar4] != '\0')) {
            puVar10[iVar7] = v;
            if (((local_7c + 3 < iVar1) && ((int)img_row_1 + 1 < iVar2)) &&
               (puVar9[(local_7c + 3) + lVar4] != '\0')) {
              bVar5 = true;
              local_7c = iVar7;
            }
            else {
              bVar5 = false;
              local_7c = iVar7;
            }
          }
          else if (((local_7c + 3 < iVar1) && ((int)img_row_1 + 1 < iVar2)) &&
                  (puVar9[(local_7c + 3) + lVar4] != '\0')) {
            v = UFPC::NewLabel();
            puVar10[iVar7] = v;
            bVar5 = true;
            local_7c = iVar7;
          }
          else {
            bVar5 = false;
            local_7c = iVar7;
          }
        }
        else {
          puVar10[iVar7] = v;
          if ((local_7c + 3 < iVar1) && (puVar9[local_7c + 3] != '\0')) {
            if (puVar9[iVar7 - lVar3] == '\0') {
              if ((local_7c + 3 < iVar1) && (puVar9[(local_7c + 3) - lVar3] != '\0')) {
                if ((local_7c + 1 < 1) || (puVar9[(local_7c + 1) - lVar3] == '\0')) {
                  UFPC::Merge(v,*(uint *)((long)puVar10 + (long)iVar7 * 4 + lVar6));
                }
                else {
                  uVar8 = UFPC::Merge(*(uint *)((long)puVar10 + (long)local_7c * 4 + lVar6),
                                      *(uint *)((long)puVar10 + (long)iVar7 * 4 + lVar6));
                  UFPC::Merge(v,uVar8);
                }
              }
              else if ((local_7c + 1 < 1) || (puVar9[(local_7c + 1) - lVar3] == '\0')) {
                if ((local_7c + 4 < iVar1) && (puVar9[(local_7c + 4) - lVar3] != '\0')) {
                  UFPC::Merge(v,*(uint *)((long)puVar10 + (long)(local_7c + 4) * 4 + lVar6));
                }
              }
              else if ((local_7c + 4 < iVar1) && (puVar9[(local_7c + 4) - lVar3] != '\0')) {
                uVar8 = UFPC::Merge(*(uint *)((long)puVar10 + (long)local_7c * 4 + lVar6),
                                    *(uint *)((long)puVar10 + (long)(local_7c + 4) * 4 + lVar6));
                UFPC::Merge(v,uVar8);
              }
              else {
                UFPC::Merge(v,*(uint *)((long)puVar10 + (long)local_7c * 4 + lVar6));
              }
            }
            else if ((local_7c + 3 < iVar1) && (puVar9[(local_7c + 3) - lVar3] != '\0')) {
              UFPC::Merge(v,*(uint *)((long)puVar10 + (long)iVar7 * 4 + lVar6));
            }
            else if ((local_7c + 4 < iVar1) && (puVar9[(local_7c + 4) - lVar3] != '\0')) {
              uVar8 = UFPC::Merge(*(uint *)((long)puVar10 + (long)iVar7 * 4 + lVar6),
                                  *(uint *)((long)puVar10 + (long)(local_7c + 4) * 4 + lVar6));
              UFPC::Merge(v,uVar8);
            }
            else {
              UFPC::Merge(v,*(uint *)((long)puVar10 + (long)iVar7 * 4 + lVar6));
            }
            bVar5 = true;
            local_7c = iVar7;
          }
          else {
            puVar10[iVar7] = v;
            if (puVar9[iVar7 - lVar3] == '\0') {
              if ((local_7c + 1 < 1) || (puVar9[(local_7c + 1) - lVar3] == '\0')) {
                if ((local_7c + 3 < iVar1) && (puVar9[(local_7c + 3) - lVar3] != '\0')) {
                  UFPC::Merge(v,*(uint *)((long)puVar10 + (long)iVar7 * 4 + lVar6));
                }
              }
              else if ((local_7c + 3 < iVar1) && (puVar9[(local_7c + 3) - lVar3] != '\0')) {
                uVar8 = UFPC::Merge(*(uint *)((long)puVar10 + (long)local_7c * 4 + lVar6),
                                    *(uint *)((long)puVar10 + (long)iVar7 * 4 + lVar6));
                UFPC::Merge(v,uVar8);
              }
              else {
                UFPC::Merge(v,*(uint *)((long)puVar10 + (long)local_7c * 4 + lVar6));
              }
            }
            else {
              UFPC::Merge(v,*(uint *)((long)puVar10 + (long)iVar7 * 4 + lVar6));
            }
            if (((local_7c + 3 < iVar1) && ((int)img_row_1 + 1 < iVar2)) &&
               (puVar9[(local_7c + 3) + lVar4] != '\0')) {
              bVar5 = true;
              local_7c = iVar7;
            }
            else {
              bVar5 = false;
              local_7c = iVar7;
            }
          }
        }
      }
    }
  }
  return;
}

Assistant:

void FirstScan()
    {
        memset(img_labels_.data, 0, img_labels_.dataend - img_labels_.datastart); // Initialization
        LabelsSolver::Setup();

        // First Scan
        int w = img_labels_.cols;
        int h = img_labels_.rows;

        int lx, u, v, k;

#define CONDITION_B1 img_row[x] > 0 
#define CONDITION_B2 x+1<w && img_row[x+1] > 0              // WRONG in the original code -> add missing condition 
#define CONDITION_B3 y+1<h && img_row_fol[x] > 0            // WRONG in the original code -> add missing condition
#define CONDITION_B4 x+1<w && y+1<h && img_row_fol[x+1] > 0 // WRONG in the original code -> add missing condition
#define CONDITION_U1 x-1>0 && img_row_prev[x-1] > 0         // WRONG in the original code -> add missing condition
#define CONDITION_U2 img_row_prev[x] > 0
#define CONDITION_U3 x+1<w && img_row_prev[x+1] > 0         // WRONG in the original code -> add missing condition
#define CONDITION_U4 x+2<w && img_row_prev[x+2] > 0         // WRONG in the original code -> add missing condition
#define ASSIGN_S img_labels_row[x] = img_labels_row[x-2]
#define ASSIGN_P img_labels_row[x] = img_labels_row_prev_prev[x-2]
#define ASSIGN_Q img_labels_row[x] = img_labels_row_prev_prev[x]
#define ASSIGN_R img_labels_row[x] = img_labels_row_prev_prev[x+2]
#define ASSIGN_LX img_labels_row[x] = lx
#define LOAD_LX u = lx
#define LOAD_PU u = img_labels_row_prev_prev[x-2]
#define LOAD_PV v = img_labels_row_prev_prev[x-2]
#define LOAD_QU u = img_labels_row_prev_prev[x]
#define LOAD_QV v = img_labels_row_prev_prev[x]
#define LOAD_QK k = img_labels_row_prev_prev[x]
#define LOAD_RV v = img_labels_row_prev_prev[x+2]
#define LOAD_RK k = img_labels_row_prev_prev[x+2]
#define NEW_LABEL lx = img_labels_row[x] = LabelsSolver::NewLabel();
#define RESOLVE_2(u, v) LabelsSolver::Merge(u,v);
#define RESOLVE_3(u, v, k) LabelsSolver::Merge(u,LabelsSolver::Merge(v,k));

        bool nextprocedure2;

        int y = 0; // Extract from the first for
        const unsigned char* const img_row = img_.ptr<unsigned char>(y);
        const unsigned char* const img_row_fol = (unsigned char *)(((char *)img_row) + img_.step.p[0]);
        unsigned int* const img_labels_row = img_labels_.ptr<unsigned int>(y);

        // Process first two rows
        for (int x = 0; x < w; x += 2) {

#include "labeling_wychang_2015_tree_0.inc.h"

        }

        for (int y = 2; y < h; y += 2) {
            const unsigned char* const img_row = img_.ptr<unsigned char>(y);
            const unsigned char* const img_row_prev = (unsigned char *)(((char *)img_row) - img_.step.p[0]);
            const unsigned char* const img_row_fol = (unsigned char *)(((char *)img_row) + img_.step.p[0]);
            unsigned int* const img_labels_row = img_labels_.ptr<unsigned int>(y);
            unsigned int* const img_labels_row_prev_prev = (unsigned int *)(((char *)img_labels_row) - img_labels_.step.p[0] - img_labels_.step.p[0]);
            for (int x = 0; x < w; x += 2) {

#include "labeling_wychang_2015_tree.inc.h"

            }
        }

#undef CONDITION_B1 
#undef CONDITION_B2 
#undef CONDITION_B3 
#undef CONDITION_B4 
#undef CONDITION_U1 
#undef CONDITION_U2 
#undef CONDITION_U3 
#undef CONDITION_U4 
#undef ASSIGN_S
#undef ASSIGN_P
#undef ASSIGN_Q
#undef ASSIGN_R
#undef ASSIGN_LX 
#undef LOAD_LX 
#undef LOAD_PU 
#undef LOAD_PV 
#undef LOAD_QU 
#undef LOAD_QV 
#undef LOAD_QK 
#undef LOAD_RV 
#undef LOAD_RK 
#undef NEW_LABEL
#undef RESOLVE_2
#undef RESOLVE_3
    }